

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_window * nk_find_window(nk_context *ctx,nk_hash hash,char *name)

{
  int iVar1;
  nk_window *pnStack_30;
  int max_len;
  nk_window *iter;
  char *name_local;
  nk_hash hash_local;
  nk_context *ctx_local;
  
  pnStack_30 = ctx->begin;
  while( true ) {
    if (pnStack_30 == (nk_window *)0x0) {
      return (nk_window *)0x0;
    }
    if (pnStack_30 == pnStack_30->next) break;
    if (pnStack_30->name == hash) {
      iVar1 = nk_strlen(pnStack_30->name_string);
      iVar1 = nk_stricmpn(pnStack_30->name_string,name,iVar1);
      if (iVar1 == 0) {
        return pnStack_30;
      }
    }
    pnStack_30 = pnStack_30->next;
  }
  __assert_fail("iter != iter->next",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x482e,
                "struct nk_window *nk_find_window(struct nk_context *, nk_hash, const char *)");
}

Assistant:

NK_INTERN struct nk_window*
nk_find_window(struct nk_context *ctx, nk_hash hash, const char *name)
{
    struct nk_window *iter;
    iter = ctx->begin;
    while (iter) {
        NK_ASSERT(iter != iter->next);
        if (iter->name == hash) {
            int max_len = nk_strlen(iter->name_string);
            if (!nk_stricmpn(iter->name_string, name, max_len))
                return iter;
        }
        iter = iter->next;
    }
    return 0;
}